

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O2

void Cmd_addslotdefault(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  uint slot;
  char *pcVar2;
  PClass *p;
  PClassWeapon *type;
  FString local_20;
  
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 == 3) {
    pcVar2 = FCommandLine::operator[](argv,1);
    slot = atoi(pcVar2);
    if (slot < 10) {
      pcVar2 = FCommandLine::operator[](argv,2);
      p = PClass::FindClass(pcVar2);
      type = dyn_cast<PClassWeapon>((DObject *)p);
      if (type == (PClassWeapon *)0x0) {
        pcVar2 = FCommandLine::operator[](argv,2);
        Printf("%s is not a weapon\n",pcVar2);
        return;
      }
      if (ParsingKeyConf == true) {
        FString::FString(&local_20,argv->cmd);
        TArray<FString,_FString>::Push(&KeyConfWeapons,&local_20);
        FString::~FString(&local_20);
        return;
      }
      if (PlayingKeyConf != (FWeaponSlots *)0x0) {
        FWeaponSlots::AddSlotDefault(PlayingKeyConf,slot,type,false);
        return;
      }
      Net_WriteByte('7');
      Net_WriteByte((BYTE)slot);
      Net_WriteWeapon(type);
      return;
    }
  }
  Printf("Usage: addslotdefault <slot> <weapon>\n");
  return;
}

Assistant:

CCMD (addslotdefault)
{
	PClassWeapon *type;
	unsigned int slot;

	if (argv.argc() != 3 || (slot = atoi (argv[1])) >= NUM_WEAPON_SLOTS)
	{
		Printf ("Usage: addslotdefault <slot> <weapon>\n");
		return;
	}

	type = dyn_cast<PClassWeapon>(PClass::FindClass(argv[2]));
	if (type == NULL)
	{
		Printf ("%s is not a weapon\n", argv[2]);
		return;
	}

	if (ParsingKeyConf)
	{
		KeyConfWeapons.Push(argv.args());
	}
	else if (PlayingKeyConf != NULL)
	{
		PlayingKeyConf->AddSlotDefault(int(slot), type, false);
	}
	else
	{
		Net_WriteByte(DEM_ADDSLOTDEFAULT);
		Net_WriteByte(slot);
		Net_WriteWeapon(type);
	}
}